

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O3

RandMode __thiscall slang::ast::ASTContext::getRandMode(ASTContext *this,Symbol *symbol)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  RandomizeDetails *pRVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  RandMode RVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  
  RVar8 = Symbol::getRandMode(symbol);
  if (RVar8 == None) {
    pRVar3 = this->randomizeDetails;
    if (pRVar3 == (RandomizeDetails *)0x0) {
      RVar8 = None;
    }
    else {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = symbol;
      uVar9 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
              SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar11 = uVar9 >> ((byte)(pRVar3->scopeRandVars).table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                               .arrays.groups_size_index & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar9 & 0xff];
      uVar13 = 0;
      do {
        pgVar1 = (pRVar3->scopeRandVars).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                 .arrays.groups_ + uVar11;
        bVar7 = pgVar1->m[0xf].n;
        uVar14 = (uchar)uVar2;
        auVar18[0] = -(pgVar1->m[0].n == uVar14);
        uVar15 = (uchar)((uint)uVar2 >> 8);
        auVar18[1] = -(pgVar1->m[1].n == uVar15);
        uVar16 = (uchar)((uint)uVar2 >> 0x10);
        auVar18[2] = -(pgVar1->m[2].n == uVar16);
        bVar17 = (byte)((uint)uVar2 >> 0x18);
        auVar18[3] = -(pgVar1->m[3].n == bVar17);
        auVar18[4] = -(pgVar1->m[4].n == uVar14);
        auVar18[5] = -(pgVar1->m[5].n == uVar15);
        auVar18[6] = -(pgVar1->m[6].n == uVar16);
        auVar18[7] = -(pgVar1->m[7].n == bVar17);
        auVar18[8] = -(pgVar1->m[8].n == uVar14);
        auVar18[9] = -(pgVar1->m[9].n == uVar15);
        auVar18[10] = -(pgVar1->m[10].n == uVar16);
        auVar18[0xb] = -(pgVar1->m[0xb].n == bVar17);
        auVar18[0xc] = -(pgVar1->m[0xc].n == uVar14);
        auVar18[0xd] = -(pgVar1->m[0xd].n == uVar15);
        auVar18[0xe] = -(pgVar1->m[0xe].n == uVar16);
        auVar18[0xf] = -(bVar7 == bVar17);
        uVar10 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
        if (uVar10 != 0) {
          do {
            uVar5 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            if ((pRVar3->scopeRandVars).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                .arrays.elements_[uVar11 * 0xf + (ulong)uVar5] == symbol) {
              return Rand;
            }
            uVar10 = uVar10 - 1 & uVar10;
          } while (uVar10 != 0);
        }
        RVar8 = None;
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar9 & 7] & bVar7) == 0) {
          return None;
        }
        uVar4 = (pRVar3->scopeRandVars).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<const_slang::ast::Symbol_*>_>
                .arrays.groups_size_mask;
        lVar12 = uVar11 + uVar13;
        uVar13 = uVar13 + 1;
        uVar11 = lVar12 + 1U & uVar4;
      } while (uVar13 <= uVar4);
    }
  }
  return RVar8;
}

Assistant:

RandMode ASTContext::getRandMode(const Symbol& symbol) const {
    RandMode mode = symbol.getRandMode();
    if (mode != RandMode::None)
        return mode;

    if (randomizeDetails) {
        if (auto it = randomizeDetails->scopeRandVars.find(&symbol);
            it != randomizeDetails->scopeRandVars.end()) {
            return RandMode::Rand;
        }
    }

    return RandMode::None;
}